

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::NamedParamAssignmentSyntax::setChild
          (NamedParamAssignmentSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00472b5c + *(int *)(&DAT_00472b5c + in_RSI * 4)))();
  return;
}

Assistant:

void NamedParamAssignmentSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: dot = child.token(); return;
        case 1: name = child.token(); return;
        case 2: openParen = child.token(); return;
        case 3: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 4: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}